

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

string * Imf_3_4::anon_unknown_23::prefixFromLayerName(string *layerName,Header *header)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  StringVector *this;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  allocator<char> *in_stack_ffffffffffffffe0;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = hasMultiView((Header *)0x24d3ad);
    if (bVar1) {
      this = multiView_abi_cxx11_((Header *)0x24d3bd);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this,0);
      _Var2 = std::operator==(in_stack_ffffffffffffffd0,in_RDI);
      if (_Var2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
        return in_RDI;
      }
    }
    std::operator+(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

string
prefixFromLayerName (const string& layerName, const Header& header)
{
    if (layerName.empty ()) return "";

    if (hasMultiView (header) && multiView (header)[0] == layerName) return "";

    return layerName + ".";
}